

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool isLessInfeasibleDSECandidate(HighsLogOptions *log_options,HighsLp *lp)

{
  pointer piVar1;
  pointer pdVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  double dVar11;
  value_type_conflict2 local_3c;
  vector<int,_std::allocator<int>_> col_length_k;
  
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&col_length_k,0x19,&local_3c);
  iVar9 = lp->num_col_;
  lVar7 = (long)iVar9;
  piVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar7 < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    pdVar2 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = *piVar1;
    uVar6 = 0xffffffff;
    lVar4 = 0;
    do {
      uVar8 = (long)piVar1[lVar4 + 1] - (long)iVar5;
      if ((int)uVar6 < (int)uVar8) {
        uVar6 = uVar8 & 0xffffffff;
      }
      if (0x18 < (int)uVar8) {
LAB_00244922:
        bVar3 = false;
        goto LAB_00244991;
      }
      col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] =
           col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8] + 1;
      iVar9 = piVar1[lVar4];
      lVar4 = lVar4 + 1;
      iVar5 = piVar1[lVar4];
      if (iVar9 < iVar5) {
        lVar7 = 0;
        do {
          dVar11 = ABS(pdVar2[iVar9 + lVar7]);
          if ((dVar11 != 1.0) || (NAN(dVar11))) goto LAB_00244922;
          lVar7 = lVar7 + 1;
        } while (iVar5 - iVar9 != (int)lVar7);
      }
      iVar9 = lp->num_col_;
      lVar7 = (long)iVar9;
    } while (lVar4 < lVar7);
  }
  bVar3 = (double)piVar1[lVar7] / (double)iVar9 <= 6.0;
  pcVar10 = "is not";
  if (bVar3) {
    pcVar10 = "is";
  }
  highsLogDev(log_options,kInfo,
              "LP %s has all |entries|=1; max column count = %d (limit %d); average column count = %0.2g (limit %d): LP is %s a candidate for LiDSE\n"
              ,(lp->model_name_)._M_dataplus._M_p,uVar6,0x18,6,pcVar10);
LAB_00244991:
  if (col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool isLessInfeasibleDSECandidate(const HighsLogOptions& log_options,
                                  const HighsLp& lp) {
  HighsInt max_col_num_en = -1;
  const HighsInt max_allowed_col_num_en = 24;
  const HighsInt max_assess_col_num_en =
      std::max(HighsInt{9}, max_allowed_col_num_en);
  const HighsInt max_average_col_num_en = 6;
  vector<HighsInt> col_length_k;
  col_length_k.resize(1 + max_assess_col_num_en, 0);
  bool LiDSE_candidate = true;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    // Check limit on number of entries in the column has not been breached
    HighsInt col_num_en =
        lp.a_matrix_.start_[col + 1] - lp.a_matrix_.start_[col];
    max_col_num_en = std::max(col_num_en, max_col_num_en);
    if (col_num_en > max_assess_col_num_en) return false;
    col_length_k[col_num_en]++;
    for (HighsInt en = lp.a_matrix_.start_[col];
         en < lp.a_matrix_.start_[col + 1]; en++) {
      double value = lp.a_matrix_.value_[en];
      // All nonzeros must be +1 or -1
      if (fabs(value) != 1) return false;
    }
  }
  double average_col_num_en = lp.a_matrix_.start_[lp.num_col_];
  average_col_num_en = average_col_num_en / lp.num_col_;
  LiDSE_candidate =
      LiDSE_candidate && average_col_num_en <= max_average_col_num_en;
  highsLogDev(log_options, HighsLogType::kInfo,
              "LP %s has all |entries|=1; max column count = %" HIGHSINT_FORMAT
              " (limit %" HIGHSINT_FORMAT
              "); average "
              "column count = %0.2g (limit %" HIGHSINT_FORMAT
              "): LP is %s a candidate for LiDSE\n",
              lp.model_name_.c_str(), max_col_num_en, max_allowed_col_num_en,
              average_col_num_en, max_average_col_num_en,
              LiDSE_candidate ? "is" : "is not");
  return LiDSE_candidate;
}